

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::MotionVectorTestLarge_OverallTest_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::MotionVectorTestLarge_OverallTest_Test>
           *this)

{
  Test *this_00;
  ParamType *pPVar1;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int>>::
  parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x400);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_01029a78;
  this_00[1]._vptr_Test = (_func_int **)&PTR__CodecTestWith3Params_01029ab8;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  this_00[2]._vptr_Test =
       (_func_int **)
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>).
       super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  *(undefined1 *)
   &this_00[2].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  this_00[0x3c]._vptr_Test = (_func_int **)(this_00 + 0x3d);
  this_00[0x3c].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined1 *)&this_00[0x3d]._vptr_Test = 0;
  this_00[0x3e]._vptr_Test = (_func_int **)0x0;
  this_00[0x3e].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined4 *)&this_00[0x3f]._vptr_Test = 0;
  *(undefined4 *)((long)&this_00[3]._vptr_Test + 4) = 1;
  this_00->_vptr_Test = (_func_int **)&PTR__MotionVectorTestLarge_01064538;
  this_00[1]._vptr_Test = (_func_int **)&PTR__MotionVectorTestLarge_01064580;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__MotionVectorTestLarge_010645a0;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  *(TestMode *)((long)&this_00[0x3f]._vptr_Test + 4) =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>).
       super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int>.
       super__Head_base<1UL,_libaom_test::TestMode,_false>._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  *(int *)&this_00[0x3f].gtest_flag_saver_._M_t.
           super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>).
       super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
       super__Head_base<2UL,_int,_false>._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  *(int *)((long)&this_00[0x3f].gtest_flag_saver_._M_t.
                  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl +
          4) = (pPVar1->
               super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>
               ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int>.
               super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
               super__Head_base<3UL,_int,_false>._M_head_impl;
  this_00->_vptr_Test = (_func_int **)&PTR__MotionVectorTestLarge_010643d8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__MotionVectorTestLarge_OverallTest_Test_01064420;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__MotionVectorTestLarge_OverallTest_Test_01064440;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }